

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

int formparse(Configurable *config,char *input,curl_httppost **httppost,curl_httppost **last_post,
             _Bool literal_value)

{
  char *pcVar1;
  int iVar2;
  char *__haystack;
  ushort **ppuVar3;
  size_t sVar4;
  size_t sVar5;
  multi_files *pmVar6;
  void *__ptr;
  bool bVar7;
  bool bVar8;
  char *local_328;
  char *ct;
  undefined4 local_2e8;
  int i_1;
  curl_forms info [4];
  uint count;
  uint i;
  multi_files *ptr_1;
  curl_forms *forms;
  char *pcStack_288;
  _Bool semicolon;
  char *filename;
  char *ptr;
  multi_files *multi_current;
  multi_files *multi_start;
  char *sep2;
  char *sep;
  char *type;
  char *contp;
  char type_minor [128];
  char type_major [128];
  char *contents;
  char name [256];
  _Bool literal_value_local;
  curl_httppost **last_post_local;
  curl_httppost **httppost_local;
  char *input_local;
  Configurable *config_local;
  
  sep = (char *)0x0;
  name[0xff] = literal_value;
  iVar2 = __isoc99_sscanf(input,"%255[^=]=",&contents);
  if ((iVar2 == 1) && (type = strchr(input,0x3d), type != (char *)0x0)) {
    __haystack = strdup(type + 1);
    if (__haystack == (char *)0x0) {
      curl_mfprintf(config->errors,"out of memory\n");
      config_local._4_4_ = 1;
    }
    else {
      if ((*__haystack == '@') && ((name[0xff] & 1U) == 0)) {
        multi_current = (multi_files *)0x0;
        ptr = (char *)0x0;
        type = __haystack + 1;
        do {
          pcStack_288 = (char *)0x0;
          sep2 = strchr(type,0x3b);
          multi_start = (multi_files *)strchr(type,0x2c);
          if ((multi_start != (multi_files *)0x0) && (multi_start < sep2)) {
            sep2 = (char *)multi_start;
          }
          sep = (char *)0x0;
          if (sep2 != (char *)0x0) {
            bVar7 = *sep2 == ';';
            *sep2 = '\0';
            filename = sep2 + 1;
            while( true ) {
              bVar8 = false;
              if ((bVar7) && (bVar8 = false, filename != (char *)0x0)) {
                bVar8 = *filename != ',';
              }
              if (!bVar8) break;
              while (ppuVar3 = __ctype_b_loc(),
                    ((*ppuVar3)[(int)(uint)(byte)*filename] & 0x2000) != 0) {
                filename = filename + 1;
              }
              iVar2 = Curl_raw_nequal("type=",filename,5);
              if (iVar2 == 0) {
                iVar2 = Curl_raw_nequal("filename=",filename,9);
                if (iVar2 == 0) break;
                pcStack_288 = filename + 9;
                filename = strchr(pcStack_288,0x3b);
                if (filename == (char *)0x0) {
                  filename = strchr(pcStack_288,0x2c);
                }
                if (filename != (char *)0x0) {
                  *filename = '\0';
                  filename = filename + 1;
                }
              }
              else {
                sep = filename + 5;
                iVar2 = __isoc99_sscanf(sep,"%127[^/]/%127[^;,\n]",type_minor + 0x78,&contp);
                pcVar1 = sep;
                if (iVar2 != 2) {
                  warnf(config,"Illegally formatted content-type field!\n");
                  if (__haystack != (char *)0x0) {
                    free(__haystack);
                  }
                  FreeMultiInfo(&multi_current,(multi_files **)&ptr);
                  return 2;
                }
                sVar4 = strlen(type_minor + 0x78);
                sVar5 = strlen((char *)&contp);
                sep2 = pcVar1 + sVar5 + sVar4 + 1;
                if (*sep2 == ';') {
                  iVar2 = Curl_raw_nequal(";filename=",sep2,10);
                  pmVar6 = (multi_files *)sep2;
                  if ((iVar2 == 0) &&
                     (multi_start = (multi_files *)strchr(sep2 + 1,0x3b), pcVar1 = sep2,
                     pmVar6 = multi_start, multi_start == (multi_files *)0x0)) {
                    sVar4 = strlen(sep2);
                    pmVar6 = (multi_files *)(pcVar1 + sVar4);
                  }
                }
                else {
                  bVar7 = false;
                  pmVar6 = (multi_files *)sep2;
                }
                sep2 = (char *)pmVar6;
                if (*sep2 == '\0') {
                  filename = (char *)0x0;
                }
                else {
                  *sep2 = '\0';
                  filename = sep2 + 1;
                }
              }
            }
            sep2 = filename;
          }
          pmVar6 = AddMultiFiles(type,sep,pcStack_288,&multi_current,(multi_files **)&ptr);
          if (pmVar6 == (multi_files *)0x0) {
            warnf(config,"Error building form post!\n");
            if (__haystack != (char *)0x0) {
              free(__haystack);
            }
            FreeMultiInfo(&multi_current,(multi_files **)&ptr);
            return 3;
          }
          type = sep2;
          bVar7 = false;
          if (sep2 != (char *)0x0) {
            bVar7 = *sep2 != '\0';
          }
        } while (bVar7);
        if (multi_current != (multi_files *)0x0) {
          info[3].value._0_4_ = 0;
          for (_count = multi_current; _count != (multi_files *)0x0; _count = _count->next) {
            info[3].value._0_4_ = (uint)info[3].value + 1;
          }
          __ptr = malloc((ulong)((uint)info[3].value + 1) << 4);
          if (__ptr == (void *)0x0) {
            curl_mfprintf(config->errors,"Error building form post!\n");
            if (__haystack != (char *)0x0) {
              free(__haystack);
            }
            FreeMultiInfo(&multi_current,(multi_files **)&ptr);
            return 4;
          }
          _count = multi_current;
          for (info[3].value._4_4_ = 0; info[3].value._4_4_ < (uint)info[3].value;
              info[3].value._4_4_ = info[3].value._4_4_ + 1) {
            *(CURLformoption *)((long)__ptr + (ulong)info[3].value._4_4_ * 0x10) =
                 (_count->form).option;
            *(char **)((long)__ptr + (ulong)info[3].value._4_4_ * 0x10 + 8) = (_count->form).value;
            _count = _count->next;
          }
          *(undefined4 *)((long)__ptr + (ulong)(uint)info[3].value * 0x10) = 0x11;
          FreeMultiInfo(&multi_current,(multi_files **)&ptr);
          iVar2 = curl_formadd(httppost,last_post,1,&contents,8,__ptr,0x11);
          if (iVar2 != 0) {
            warnf(config,"curl_formadd failed!\n");
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (__haystack != (char *)0x0) {
              free(__haystack);
            }
            return 5;
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
      }
      else {
        type = __haystack;
        if ((name[0xff] & 1U) == 0) {
          local_328 = strstr(__haystack,";type=");
        }
        else {
          local_328 = (char *)0x0;
        }
        local_2e8 = 1;
        info[0]._0_8_ = &contents;
        ct._4_4_ = 1;
        if (local_328 != (char *)0x0) {
          info[0].value._0_4_ = 0xe;
          info[1]._0_8_ = local_328 + 6;
          ct._4_4_ = 2;
          *local_328 = '\0';
        }
        if ((*type == '<') && ((name[0xff] & 1U) == 0)) {
          (&local_2e8)[(long)ct._4_4_ * 4] = 7;
          *(char **)(info + ct._4_4_) = type + 1;
          (&local_2e8)[(long)(ct._4_4_ + 1) * 4] = 0x11;
          iVar2 = curl_formadd(httppost,last_post,8,&local_2e8,0x11);
          if (iVar2 != 0) {
            warnf(config,"curl_formadd failed, possibly the file %s is bad!\n",type + 1);
            if (__haystack != (char *)0x0) {
              free(__haystack);
            }
            return 6;
          }
        }
        else {
          (&local_2e8)[(long)ct._4_4_ * 4] = 4;
          *(char **)(info + ct._4_4_) = type;
          (&local_2e8)[(long)(ct._4_4_ + 1) * 4] = 0x11;
          iVar2 = curl_formadd(httppost,last_post,8,&local_2e8,0x11);
          if (iVar2 != 0) {
            warnf(config,"curl_formadd failed!\n");
            if (__haystack != (char *)0x0) {
              free(__haystack);
            }
            return 8;
          }
        }
      }
      if (__haystack != (char *)0x0) {
        free(__haystack);
      }
      config_local._4_4_ = 0;
    }
  }
  else {
    warnf(config,"Illegally formatted input field!\n");
    config_local._4_4_ = 1;
  }
  return config_local._4_4_;
}

Assistant:

int formparse(struct Configurable *config,
              const char *input,
              struct curl_httppost **httppost,
              struct curl_httppost **last_post,
              bool literal_value)
{
  /* nextarg MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char name[256];
  char *contents = NULL;
  char type_major[128];
  char type_minor[128];
  char *contp;
  const char *type = NULL;
  char *sep;
  char *sep2;

  if((1 == sscanf(input, "%255[^=]=", name)) &&
     ((contp = strchr(input, '=')) != NULL)) {
    /* the input was using the correct format */

    /* Allocate the contents */
    contents = strdup(contp+1);
    if(!contents) {
      fprintf(config->errors, "out of memory\n");
      return 1;
    }
    contp = contents;

    if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      struct multi_files *multi_start = NULL;
      struct multi_files *multi_current = NULL;

      contp++;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        char *ptr;
        char *filename = NULL;

        sep = strchr(contp, ';');
        sep2 = strchr(contp, ',');

        /* pick the closest */
        if(sep2 && (sep2 < sep)) {
          sep = sep2;

          /* no type was specified! */
        }

        type = NULL;

        if(sep) {
          bool semicolon = (';' == *sep) ? TRUE : FALSE;

          *sep = '\0'; /* terminate file name at separator */

          ptr = sep+1; /* point to the text following the separator */

          while(semicolon && ptr && (','!= *ptr)) {

            /* pass all white spaces */
            while(ISSPACE(*ptr))
              ptr++;

            if(checkprefix("type=", ptr)) {
              /* set type pointer */
              type = &ptr[5];

              /* verify that this is a fine type specifier */
              if(2 != sscanf(type, "%127[^/]/%127[^;,\n]",
                             type_major, type_minor)) {
                warnf(config, "Illegally formatted content-type field!\n");
                Curl_safefree(contents);
                FreeMultiInfo(&multi_start, &multi_current);
                return 2; /* illegal content-type syntax! */
              }

              /* now point beyond the content-type specifier */
              sep = (char *)type + strlen(type_major)+strlen(type_minor)+1;

              /* there's a semicolon following - we check if it is a filename
                 specified and if not we simply assume that it is text that
                 the user wants included in the type and include that too up
                 to the next zero or semicolon. */
              if(*sep==';') {
                if(!checkprefix(";filename=", sep)) {
                  sep2 = strchr(sep+1, ';');
                  if(sep2)
                    sep = sep2;
                  else
                    sep = sep + strlen(sep); /* point to end of string */
                }
              }
              else
                semicolon = FALSE;

              if(*sep) {
                *sep = '\0'; /* zero terminate type string */

                ptr = sep+1;
              }
              else
                ptr = NULL; /* end */
            }
            else if(checkprefix("filename=", ptr)) {
              filename = &ptr[9];
              ptr = strchr(filename, ';');
              if(!ptr) {
                ptr = strchr(filename, ',');
              }
              if(ptr) {
                *ptr = '\0'; /* zero terminate */
                ptr++;
              }
            }
            else
              /* confusion, bail out of loop */
              break;
          }

          sep = ptr;
        }

        /* if type == NULL curl_formadd takes care of the problem */

        if(!AddMultiFiles(contp, type, filename, &multi_start,
                          &multi_current)) {
          warnf(config, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 3;
        }
        contp = sep; /* move the contents pointer to after the separator */

      } while(sep && *sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(multi_start) {
        struct curl_forms *forms = NULL;
        struct multi_files *ptr = multi_start;
        unsigned int i, count = 0;
        while(ptr) {
          ptr = ptr->next;
          ++count;
        }
        forms = malloc((count+1)*sizeof(struct curl_forms));
        if(!forms) {
          fprintf(config->errors, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 4;
        }
        for(i = 0, ptr = multi_start; i < count; ++i, ptr = ptr->next) {
          forms[i].option = ptr->form.option;
          forms[i].value = ptr->form.value;
        }
        forms[count].option = CURLFORM_END;
        FreeMultiInfo(&multi_start, &multi_current);
        if(curl_formadd(httppost, last_post,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_ARRAY, forms, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(forms);
          Curl_safefree(contents);
          return 5;
        }
        Curl_safefree(forms);
      }
    }
    else {
      struct curl_forms info[4];
      int i = 0;
      char *ct = literal_value ? NULL : strstr(contp, ";type=");

      info[i].option = CURLFORM_COPYNAME;
      info[i].value = name;
      i++;

      if(ct) {
        info[i].option = CURLFORM_CONTENTTYPE;
        info[i].value = &ct[6];
        i++;
        ct[0] = '\0'; /* zero terminate here */
      }

      if(contp[0]=='<' && !literal_value) {
        info[i].option = CURLFORM_FILECONTENT;
        info[i].value = contp+1;
        i++;
        info[i].option = CURLFORM_END;

        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END ) != 0) {
          warnf(config, "curl_formadd failed, possibly the file %s is bad!\n",
                contp+1);
          Curl_safefree(contents);
          return 6;
        }
      }
      else {
#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(contp, strlen(contp))) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 7;
        }
#endif
        info[i].option = CURLFORM_COPYCONTENTS;
        info[i].value = contp;
        i++;
        info[i].option = CURLFORM_END;
        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 8;
        }
      }
    }

  }
  else {
    warnf(config, "Illegally formatted input field!\n");
    return 1;
  }
  Curl_safefree(contents);
  return 0;
}